

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O2

void __thiscall Display::Display(Display *this,char *filebase)

{
  ofstream *this_00;
  allocator<char> local_91 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,filebase,(allocator<char> *)&local_70);
  (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sTitle)._M_dataplus._M_p = (pointer)&(this->sTitle).field_2;
  (this->sTitle)._M_string_length = 0;
  (this->sTitle).field_2._M_local_buf[0] = '\0';
  (this->sUserSettings)._M_dataplus._M_p = (pointer)&(this->sUserSettings).field_2;
  (this->sUserSettings)._M_string_length = 0;
  (this->sUserSettings).field_2._M_local_buf[0] = '\0';
  (this->sXFont)._M_dataplus._M_p = (pointer)&(this->sXFont).field_2;
  (this->sXFont)._M_string_length = 0;
  (this->sXFont).field_2._M_local_buf[0] = '\0';
  (this->sYFont)._M_dataplus._M_p = (pointer)&(this->sYFont).field_2;
  (this->sYFont)._M_string_length = 0;
  (this->sYFont).field_2._M_local_buf[0] = '\0';
  (this->sZFont)._M_dataplus._M_p = (pointer)&(this->sZFont).field_2;
  (this->sZFont)._M_string_length = 0;
  (this->sZFont).field_2._M_local_buf[0] = '\0';
  (this->sXTicFont)._M_dataplus._M_p = (pointer)&(this->sXTicFont).field_2;
  (this->sXTicFont)._M_string_length = 0;
  (this->sXTicFont).field_2._M_local_buf[0] = '\0';
  (this->sYTicFont)._M_dataplus._M_p = (pointer)&(this->sYTicFont).field_2;
  (this->sYTicFont)._M_string_length = 0;
  (this->sYTicFont).field_2._M_local_buf[0] = '\0';
  (this->sZTicFont)._M_dataplus._M_p = (pointer)&(this->sZTicFont).field_2;
  (this->sZTicFont)._M_string_length = 0;
  (this->sZTicFont).field_2._M_local_buf[0] = '\0';
  this->pFile = (ofstream *)0x0;
  this_00 = (ofstream *)operator_new(0x200);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,".gnuplot",local_91);
  std::operator+(&local_70,&this->sFileBase,&local_50);
  std::ofstream::ofstream(this_00,local_70._M_dataplus._M_p,_S_trunc);
  this->pFile = this_00;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  this->nMode = 0;
  return;
}

Assistant:

Display::Display(const char *filebase) : sFileBase( filebase )
{
	pFile = 0;
	pFile = new ofstream( (sFileBase + string(".gnuplot")).c_str(), ios_base::trunc );
	nMode = 0;
}